

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EmptyRoomListView.cpp
# Opt level: O1

void __thiscall EmptyRoomListView::display(EmptyRoomListView *this)

{
  Room *pRVar1;
  int iVar2;
  undefined4 extraout_var;
  ostream *poVar3;
  Controller *this_00;
  View *pVVar4;
  Room *room;
  Room *this_01;
  string local_50;
  
  getParams(this);
  iVar2 = (*(this->super_ListView<Room>).super_MultipleObjectMixin<Room>.super_Model<Room>.
            _vptr_Model[2])(this);
  pRVar1 = (Room *)((undefined8 *)CONCAT44(extraout_var,iVar2))[1];
  for (this_01 = *(Room **)CONCAT44(extraout_var,iVar2); this_01 != pRVar1; this_01 = this_01 + 1) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Room #",6);
    iVar2 = Room::getRoomNumber(this_01);
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ID: ",6);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,(this_01->super_Model<Room>).id);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
  }
  this_00 = Controller::getInstance();
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"faculty-panel","");
  pVVar4 = Controller::getView(this_00,&local_50);
  View::response->view = pVVar4;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  return;
}

Assistant:

void EmptyRoomListView::display() {
    getParams();
    for (auto &room : getQueryset()) {
        cout << "Room #" << room.getRoomNumber() << ", ID: " << room.getId() << "\n";
    }
    response->view = Controller::getInstance().getView("faculty-panel");
}